

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qclipboard.cpp
# Opt level: O1

void QClipboard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QClipboard_to_subr *candidate;
  undefined4 uVar2;
  void **ppvVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((((code *)*plVar1 == changed) && (uVar2 = 0, plVar1[1] == 0)) ||
         (((code *)*plVar1 == selectionChanged && (uVar2 = 1, plVar1[1] == 0)))) ||
        (((code *)*plVar1 == findBufferChanged && (uVar2 = 2, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == dataChanged && (uVar2 = 3, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
    goto LAB_002bf4d2;
  }
  if (_c != InvokeMetaMethod) goto LAB_002bf4d2;
  switch(_id) {
  case 0:
    local_2c = *_a[1];
    puStack_20 = &local_2c;
    ppvVar3 = &local_28;
    local_28 = (void *)0x0;
    iVar4 = 0;
    goto LAB_002bf462;
  case 1:
    iVar4 = 1;
    break;
  case 2:
    iVar4 = 2;
    break;
  case 3:
    iVar4 = 3;
    break;
  default:
    goto LAB_002bf4d2;
  }
  ppvVar3 = (void **)0x0;
LAB_002bf462:
  QMetaObject::activate(_o,&staticMetaObject,iVar4,ppvVar3);
LAB_002bf4d2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QClipboard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QClipboard *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->changed((*reinterpret_cast< std::add_pointer_t<QClipboard::Mode>>(_a[1]))); break;
        case 1: _t->selectionChanged(); break;
        case 2: _t->findBufferChanged(); break;
        case 3: _t->dataChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)(QClipboard::Mode )>(_a, &QClipboard::changed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::selectionChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::findBufferChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::dataChanged, 3))
            return;
    }
}